

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

DynamicState * __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::operator=(DynamicState *this,DynamicState *other)

{
  uint uVar1;
  VkDynamicState *__first;
  allocator_type local_29;
  void *local_28 [2];
  long local_18;
  
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       (other->super_VkPipelineDynamicStateCreateInfo).sType;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext =
       (other->super_VkPipelineDynamicStateCreateInfo).pNext;
  (this->super_VkPipelineDynamicStateCreateInfo).flags =
       (other->super_VkPipelineDynamicStateCreateInfo).flags;
  uVar1 = (other->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount = uVar1;
  __first = (other->super_VkPipelineDynamicStateCreateInfo).pDynamicStates;
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)local_28,__first,
             __first + uVar1,&local_29);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::_M_move_assign
            (&this->m_dynamicStates,
             (vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)local_28);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates =
       (this->m_dynamicStates).
       super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  return this;
}

Assistant:

PipelineCreateInfo::DynamicState& PipelineCreateInfo::DynamicState::operator= (const DynamicState& other)
{
	sType = other.sType;
	pNext = other.pNext;

	flags				= other.flags;
	dynamicStateCount	= other.dynamicStateCount;
	m_dynamicStates		= std::vector<vk::VkDynamicState>(other.pDynamicStates, other.pDynamicStates + dynamicStateCount);
	pDynamicStates		= &m_dynamicStates[0];

	return *this;
}